

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.h
# Opt level: O3

string * __thiscall
cmGlobalGenerator::FrameworkDescriptor::GetFrameworkPath_abi_cxx11_
          (string *__return_storage_ptr__,FrameworkDescriptor *this)

{
  size_type sVar1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_a0;
  undefined8 local_88;
  char *local_80;
  undefined8 local_78;
  size_type local_70;
  pointer local_68;
  undefined8 local_60;
  undefined8 local_58;
  char *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  char *local_30;
  char local_28 [32];
  
  local_a0.first._M_len = (this->Directory)._M_string_length;
  if (local_a0.first._M_len == 0) {
    local_a0.first._M_str = (this->Name)._M_dataplus._M_p;
    local_a0.first._M_len = (this->Name)._M_string_length;
    local_88 = 10;
    local_80 = ".framework";
    sVar1 = 2;
  }
  else {
    local_a0.first._M_str = (this->Directory)._M_dataplus._M_p;
    local_80 = local_28;
    local_40 = 0;
    local_38 = 1;
    local_28[0] = '/';
    local_88 = 1;
    local_68 = (this->Name)._M_dataplus._M_p;
    local_70 = (this->Name)._M_string_length;
    local_60 = 0;
    local_58 = 10;
    local_50 = ".framework";
    local_48 = 0;
    sVar1 = 4;
    local_30 = local_80;
  }
  local_78 = 0;
  local_a0.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  views._M_array = &local_a0;
  views._M_len = sVar1;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

std::string GetFrameworkPath() const
    {
      return this->Directory.empty()
        ? cmStrCat(this->Name, ".framework"_s)
        : cmStrCat(this->Directory, '/', this->Name, ".framework"_s);
    }